

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplatedCustomNamer.cpp
# Opt level: O3

string * anon_unknown.dwarf_429104::replaceIfContains
                   (string *__return_storage_ptr__,string *input,string *pattern,
                   function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                   *replacer)

{
  pointer pcVar1;
  undefined8 uVar2;
  bool bVar3;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *psVar4;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  bVar3 = ApprovalTests::StringUtils::contains((string *)input,(string *)pattern);
  if (bVar3) {
    pcVar1 = (input->_M_dataplus)._M_p;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar1,pcVar1 + input->_M_string_length);
    if ((replacer->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*replacer->_M_invoker)(&local_48,(_Any_data *)replacer);
    ApprovalTests::StringUtils::replaceAll
              ((string *)__return_storage_ptr__,&local_68,(string *)pattern,(string *)&local_48);
    psVar4 = (string *)&local_48.field_2;
    if ((string *)local_48._M_dataplus._M_p != psVar4) {
      operator_delete(local_48._M_dataplus._M_p);
      psVar4 = extraout_RAX;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
      psVar4 = extraout_RAX_00;
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (input->_M_dataplus)._M_p;
    psVar4 = (string *)&input->field_2;
    if ((string *)pcVar1 == psVar4) {
      uVar2 = *(undefined8 *)((long)&input->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *(size_type *)psVar4;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *(size_type *)psVar4;
    }
    __return_storage_ptr__->_M_string_length = input->_M_string_length;
    (input->_M_dataplus)._M_p = (pointer)psVar4;
    input->_M_string_length = 0;
    (input->field_2)._M_local_buf[0] = '\0';
  }
  return psVar4;
}

Assistant:

std::string replaceIfContains(std::string input,
                                  std::string pattern,
                                  std::function<std::string(void)> replacer)
    {
        if (!ApprovalTests::StringUtils::contains(input, pattern))
        {
            return input;
        }
        return ApprovalTests::StringUtils::replaceAll(input, pattern, replacer());
    }